

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O2

gme_err_t gme_open_data(void *data,long size,Music_Emu **out,int sample_rate)

{
  char *extension_;
  gme_type_t type;
  Music_Emu *me;
  gme_err_t pcVar1;
  
  *out = (Music_Emu *)0x0;
  if (3 < size) {
    extension_ = gme_identify_header(data);
    type = gme_identify_extension(extension_);
    if (type != (gme_type_t)0x0) {
      me = gme_new_emu(type,sample_rate);
      if (me == (Music_Emu *)0x0) {
        return "Out of memory";
      }
      pcVar1 = gme_load_data(me,data,size);
      if (pcVar1 != (gme_err_t)0x0) {
        (*(me->super_Gme_File)._vptr_Gme_File[1])(me);
        return pcVar1;
      }
      *out = me;
      return (gme_err_t)0x0;
    }
  }
  return "Wrong file type for this emulator";
}

Assistant:

BLARGG_EXPORT gme_err_t gme_open_data( void const* data, long size, Music_Emu** out, int sample_rate )
{
	require( (data || !size) && out );
	*out = 0;
	
	gme_type_t file_type = 0;
	if ( size >= 4 )
		file_type = gme_identify_extension( gme_identify_header( data ) );
	if ( !file_type )
		return gme_wrong_file_type;
	
	Music_Emu* emu = gme_new_emu( file_type, sample_rate );
	CHECK_ALLOC( emu );
	
	gme_err_t err = gme_load_data( emu, data, size );
	
	if ( err )
		delete emu;
	else
		*out = emu;
	
	return err;
}